

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::anon_unknown_1::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  ostream *poVar1;
  bool bVar2;
  Colour colour;
  string local_30;
  
  bVar2 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar2) {
    local_30._M_dataplus._M_p._0_1_ = 0;
    Colour::use(FileName);
    std::__ostream_insert<char,std::char_traits<char>>(this->stream," for: ",6);
    Colour::use(None);
    poVar1 = this->stream;
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_30,this->result);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(char *)CONCAT71(local_30._M_dataplus._M_p._1_7_,
                                       local_30._M_dataplus._M_p._0_1_),local_30._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_) !=
        &local_30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_));
    }
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
        if (result.hasExpandedExpression()) {
            {
                Colour colour(dimColour());
                stream << " for: ";
            }
            stream << result.getExpandedExpression();
        }
    }